

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

QSet<QSpanCollection::Span_*> __thiscall
QSpanCollection::spansInRect(QSpanCollection *this,int x,int y,int w,int h)

{
  long lVar1;
  Span *this_00;
  bool bVar2;
  int iVar3;
  int *piVar4;
  Span **ppSVar5;
  int in_ECX;
  int in_EDX;
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *in_RSI;
  Data *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  QSet<QSpanCollection::Span_*> *list;
  Span *s;
  const_iterator it_x;
  const_iterator it_y;
  const_iterator *in_stack_ffffffffffffff68;
  Hash this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  this_01.d = in_RDI;
  QSet<QSpanCollection::Span_*>::QSet((QSet<QSpanCollection::Span_*> *)0x8b08d3);
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound(in_RSI,(int *)this_01.d);
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end(in_RSI);
  bVar2 = ::operator==((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffff68);
  if (bVar2) {
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::operator--
              ((const_iterator *)in_RDI);
  }
  while (piVar4 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::key
                            ((const_iterator *)0x8b0954), -*piVar4 <= in_ECX + in_R9D) {
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::operator*
              ((const_iterator *)0x8b0984);
    QMap<int,_QSpanCollection::Span_*>::lowerBound
              ((QMap<int,_QSpanCollection::Span_*> *)in_RSI,(int *)this_01.d);
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::operator*
              ((const_iterator *)0x8b09ad);
    QMap<int,_QSpanCollection::Span_*>::end((QMap<int,_QSpanCollection::Span_*> *)in_RSI);
    bVar2 = ::operator==((const_iterator *)in_RDI,in_stack_ffffffffffffff68);
    if (bVar2) {
      QMap<int,_QSpanCollection::Span_*>::const_iterator::operator--((const_iterator *)in_RDI);
    }
    while (piVar4 = QMap<int,_QSpanCollection::Span_*>::const_iterator::key
                              ((const_iterator *)0x8b09e5), -*piVar4 <= in_EDX + in_R8D) {
      ppSVar5 = QMap<int,_QSpanCollection::Span_*>::const_iterator::operator*
                          ((const_iterator *)0x8b0a06);
      this_00 = *ppSVar5;
      iVar3 = Span::bottom(this_00);
      if ((in_ECX <= iVar3) && (iVar3 = Span::right(this_00), in_EDX <= iVar3)) {
        QSet<QSpanCollection::Span_*>::operator<<
                  ((QSet<QSpanCollection::Span_*> *)this_01.d,(Span **)in_RDI);
      }
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::operator*
                ((const_iterator *)0x8b0a4a);
      QMap<int,_QSpanCollection::Span_*>::begin((QMap<int,_QSpanCollection::Span_*> *)in_RSI);
      bVar2 = ::operator==((const_iterator *)in_RDI,in_stack_ffffffffffffff68);
      if (bVar2) break;
      QMap<int,_QSpanCollection::Span_*>::const_iterator::operator--((const_iterator *)in_RDI);
    }
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin(in_RSI);
    bVar2 = ::operator==((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffff68);
    if (bVar2) break;
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::operator--
              ((const_iterator *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSet<QSpanCollection::Span_*>)(Hash)this_01.d;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QSpanCollection::Span *> QSpanCollection::spansInRect(int x, int y, int w, int h) const
{
    QSet<Span *> list;
    Index::const_iterator it_y = index.lowerBound(-y);
    if (it_y == index.end())
        --it_y;
    while(-it_y.key() <= y + h) {
        SubIndex::const_iterator it_x = (*it_y).lowerBound(-x);
        if (it_x == (*it_y).end())
            --it_x;
        while(-it_x.key() <= x + w) {
            Span *s = *it_x;
            if (s->bottom() >= y && s->right() >= x)
                list << s;
            if (it_x == (*it_y).begin())
                break;
            --it_x;
        }
        if (it_y == index.begin())
            break;
        --it_y;
    }
    return list;
}